

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

iter_type __thiscall
booster::locale::impl_icu::num_parse<wchar_t>::do_real_get<double>
          (num_parse<wchar_t> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          double *val)

{
  int *piVar1;
  bool bVar2;
  int_type iVar3;
  int_type iVar4;
  int_type iVar5;
  int iVar6;
  int_type iVar7;
  long *plVar8;
  ios_info *this_00;
  uint64_t uVar9;
  ulong uVar10;
  streambuf_type *psVar11;
  ulong uVar12;
  streambuf_type *psVar13;
  bool bVar14;
  iter_type iVar15;
  undefined1 auVar16 [12];
  _func_int **local_70;
  base_formatter local_68;
  num_parse<wchar_t> *local_60;
  string_type tmp;
  cast_type value;
  
  psVar11 = end._M_sbuf;
  psVar13 = in._M_sbuf;
  iVar7 = end._M_c;
  iVar5 = in._M_c;
  local_60 = this;
  plVar8 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::wistream::typeinfo,
                                  0xffffffffffffffff);
  bVar14 = true;
  if (plVar8 == (long *)0x0) {
    local_70 = (_func_int **)0x0;
    bVar2 = false;
  }
  else {
    this_00 = ios_info::get(ios);
    uVar9 = ios_info::display_flags(this_00);
    if (uVar9 == 0) {
      local_70 = (_func_int **)0x0;
      bVar2 = false;
      bVar14 = true;
    }
    else {
      formatter<wchar_t>::create
                ((formatter<wchar_t> *)&local_68,ios,&local_60->loc_,&local_60->enc_);
      local_70 = local_68._vptr_base_formatter;
      local_68._vptr_base_formatter = (_func_int **)0x0;
      bVar14 = local_70 == (_func_int **)0x0;
      bVar2 = true;
    }
  }
  if ((bVar2) && (local_68._vptr_base_formatter != (_func_int **)0x0)) {
    (**(code **)(*local_68._vptr_base_formatter + 8))();
  }
  if (!bVar14) {
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::reserve((ulong)&tmp);
    while( true ) {
      iVar3 = iVar5;
      if (iVar5 == 0xffffffff && psVar13 != (streambuf_type *)0x0) {
        if (*(int_type **)(psVar13 + 0x10) < *(int_type **)(psVar13 + 0x18)) {
          iVar3 = **(int_type **)(psVar13 + 0x10);
        }
        else {
          iVar3 = (**(code **)(*(long *)psVar13 + 0x48))(psVar13);
        }
        if (iVar3 == 0xffffffff) {
          psVar13 = (streambuf_type *)0x0;
        }
      }
      iVar4 = iVar7;
      if (psVar11 != (streambuf_type *)0x0 && iVar7 == 0xffffffff) {
        if (*(int_type **)(psVar11 + 0x10) < *(int_type **)(psVar11 + 0x18)) {
          iVar4 = **(int_type **)(psVar11 + 0x10);
        }
        else {
          iVar4 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
        }
        if (iVar4 == 0xffffffff) {
          psVar11 = (streambuf_type *)0x0;
        }
      }
      if ((iVar4 == 0xffffffff) == (iVar3 == 0xffffffff)) break;
      iVar3 = iVar5;
      if (psVar13 != (streambuf_type *)0x0 && iVar5 == 0xffffffff) {
        if (*(int_type **)(psVar13 + 0x10) < *(int_type **)(psVar13 + 0x18)) {
          iVar3 = **(int_type **)(psVar13 + 0x10);
        }
        else {
          iVar3 = (**(code **)(*(long *)psVar13 + 0x48))(psVar13);
        }
        if (iVar3 == 0xffffffff) {
          psVar13 = (streambuf_type *)0x0;
        }
      }
      if (iVar3 != 0x7f && 0x1f < iVar3 - 1) break;
      if (*(ulong *)(psVar13 + 0x10) < *(ulong *)(psVar13 + 0x18)) {
        *(ulong *)(psVar13 + 0x10) = *(ulong *)(psVar13 + 0x10) + 4;
        iVar5 = 0xffffffff;
      }
      else {
        iVar5 = 0xffffffff;
        (**(code **)(*(long *)psVar13 + 0x50))(psVar13);
      }
    }
    do {
      if (0xfff < tmp._M_string_length) goto LAB_00197fac;
      iVar3 = iVar5;
      if (iVar5 == 0xffffffff && psVar13 != (streambuf_type *)0x0) {
        if (*(int_type **)(psVar13 + 0x10) < *(int_type **)(psVar13 + 0x18)) {
          iVar3 = **(int_type **)(psVar13 + 0x10);
        }
        else {
          iVar3 = (**(code **)(*(long *)psVar13 + 0x48))(psVar13);
        }
        if (iVar3 == 0xffffffff) {
          psVar13 = (streambuf_type *)0x0;
        }
      }
      iVar4 = iVar7;
      if (psVar11 != (streambuf_type *)0x0 && iVar7 == 0xffffffff) {
        if (*(int_type **)(psVar11 + 0x10) < *(int_type **)(psVar11 + 0x18)) {
          iVar4 = **(int_type **)(psVar11 + 0x10);
        }
        else {
          iVar4 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
        }
        if (iVar4 == 0xffffffff) {
          psVar11 = (streambuf_type *)0x0;
        }
      }
      if ((iVar3 == 0xffffffff) == (iVar4 == 0xffffffff)) goto LAB_00197fac;
      if (psVar13 != (streambuf_type *)0x0 && iVar5 == 0xffffffff) {
        if (*(int_type **)(psVar13 + 0x10) < *(int_type **)(psVar13 + 0x18)) {
          iVar5 = **(int_type **)(psVar13 + 0x10);
        }
        else {
          iVar5 = (**(code **)(*(long *)psVar13 + 0x48))(psVar13);
        }
        if (iVar5 == 0xffffffff) {
          psVar13 = (streambuf_type *)0x0;
        }
      }
      if (iVar5 == 10) goto LAB_00197fac;
      piVar1 = *(int **)(psVar13 + 0x10);
      if (piVar1 < *(int **)(psVar13 + 0x18)) {
        iVar6 = *piVar1;
        *(int **)(psVar13 + 0x10) = piVar1 + 1;
      }
      else {
        iVar6 = (**(code **)(*(long *)psVar13 + 0x50))(psVar13);
      }
      if (((psVar13 != (streambuf_type *)0x0) && (iVar6 == -1)) &&
         (*(ulong *)(psVar13 + 0x18) <= *(ulong *)(psVar13 + 0x10))) {
        (**(code **)(*(long *)psVar13 + 0x48))(psVar13);
      }
      iVar5 = 0xffffffff;
      std::__cxx11::wstring::push_back((wchar_t)&tmp);
    } while( true );
  }
  auVar16 = std::num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
            do_get(local_60,psVar13,iVar5,psVar11,end._8_8_ & 0xffffffff,ios,err,val);
  psVar13 = auVar16._0_8_;
  uVar12 = (ulong)auVar16._8_4_;
LAB_00198091:
  if (local_70 != (_func_int **)0x0) {
    (**(code **)(*local_70 + 8))(local_70);
  }
  iVar15._8_8_ = uVar12;
  iVar15._M_sbuf = psVar13;
  return iVar15;
LAB_00197fac:
  uVar10 = (**(code **)(*local_70 + 0x28))(local_70,&tmp,&value);
  uVar12 = tmp._M_string_length;
  if (uVar10 == 0) {
    *(undefined1 *)err = (char)*err | _S_failbit;
  }
  else {
    *val = value;
  }
  for (; uVar10 < uVar12; uVar12 = uVar12 - 1) {
    std::wistream::putback((wchar_t)plVar8);
  }
  psVar13 = *(streambuf_type **)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0xe8);
  if (psVar13 == (streambuf_type *)0x0) {
    bVar14 = true;
  }
  else {
    if (*(int **)(psVar13 + 0x10) < *(int **)(psVar13 + 0x18)) {
      iVar6 = **(int **)(psVar13 + 0x10);
    }
    else {
      iVar6 = (**(code **)(*(long *)psVar13 + 0x48))(psVar13);
    }
    bVar14 = iVar6 == -1;
    if (bVar14) {
      psVar13 = (streambuf_type *)0x0;
    }
  }
  if (psVar11 != (streambuf_type *)0x0 && iVar7 == 0xffffffff) {
    if (*(int_type **)(psVar11 + 0x10) < *(int_type **)(psVar11 + 0x18)) {
      iVar7 = **(int_type **)(psVar11 + 0x10);
    }
    else {
      iVar7 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
    }
  }
  if ((bool)(bVar14 ^ iVar7 != 0xffffffff)) {
    *(undefined1 *)err = (char)*err | _S_eofbit;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)tmp._M_dataplus._M_p != &tmp.field_2) {
    operator_delete(tmp._M_dataplus._M_p);
  }
  uVar12 = 0xffffffff;
  goto LAB_00198091;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }